

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstructionFolder::OperateWords
          (InstructionFolder *this,Op opcode,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operand_words)

{
  uint32_t uVar1;
  uint32_t b;
  size_type sVar2;
  const_reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operand_words_local;
  Op opcode_local;
  InstructionFolder *this_local;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(operand_words);
  if (sVar2 == 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(operand_words);
    this_local._4_4_ = UnaryOperate(this,opcode,*pvVar3);
  }
  else if (sVar2 == 2) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(operand_words);
    uVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(operand_words);
    this_local._4_4_ = BinaryOperate(this,opcode,uVar1,*pvVar3);
  }
  else {
    if (sVar2 != 3) {
      __assert_fail("false && \"Invalid number of operands\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                    ,0xaf,
                    "uint32_t spvtools::opt::InstructionFolder::OperateWords(spv::Op, const std::vector<uint32_t> &) const"
                   );
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operand_words,0);
    uVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operand_words,1);
    b = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](operand_words,2);
    this_local._4_4_ = TernaryOperate(this,opcode,uVar1,b,*pvVar3);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t InstructionFolder::OperateWords(
    spv::Op opcode, const std::vector<uint32_t>& operand_words) const {
  switch (operand_words.size()) {
    case 1:
      return UnaryOperate(opcode, operand_words.front());
    case 2:
      return BinaryOperate(opcode, operand_words.front(), operand_words.back());
    case 3:
      return TernaryOperate(opcode, operand_words[0], operand_words[1],
                            operand_words[2]);
    default:
      assert(false && "Invalid number of operands");
      return 0;
  }
}